

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O2

uint trng::lcg64_shift::log2_floor(result_type x)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  for (; x != 0; x = x >> 1) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

TRNG_CUDA_ENABLE
  inline unsigned int lcg64_shift::log2_floor(lcg64_shift::result_type x) {
    unsigned int y{0};
    while (x > 0) {
      x >>= 1u;
      ++y;
    }
    --y;
    return y;
  }